

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getHighsOptionValue(Highs *this,string *option,string *value)

{
  HighsStatus HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"getHighsOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"getOptionValue",&local_5a);
  deprecationMessage(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = getOptionValue(this,option,value);
  return HVar1;
}

Assistant:

HighsStatus Highs::getHighsOptionValue(const std::string& option,
                                       std::string& value) {
  deprecationMessage("getHighsOptionValue", "getOptionValue");
  return getOptionValue(option, value);
}